

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_flac_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                      void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                      ma_allocation_callbacks *pAllocationCallbacks,ma_flac *pFlac)

{
  ma_dr_flac *pmVar1;
  ma_decoding_backend_config *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  ma_flac *in_R8;
  ma_dr_flac_seek_proc in_R9;
  long in_stack_00000008;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  local_4 = ma_flac_init_internal(in_RCX,in_R8);
  if (local_4 == MA_SUCCESS) {
    if ((in_RDI == 0) || (in_RSI == 0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *(long *)(in_stack_00000008 + 0x48) = in_RDI;
      *(long *)(in_stack_00000008 + 0x50) = in_RSI;
      *(undefined8 *)(in_stack_00000008 + 0x58) = in_RDX;
      *(ma_decoding_backend_config **)(in_stack_00000008 + 0x60) = in_RCX;
      pmVar1 = ma_dr_flac_open((ma_dr_flac_read_proc)in_R8,in_R9,
                               (void *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *(ma_dr_flac **)(in_stack_00000008 + 0x70) = pmVar1;
      if (*(long *)(in_stack_00000008 + 0x70) == 0) {
        local_4 = MA_INVALID_FILE;
      }
      else {
        local_4 = MA_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_flac_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_flac* pFlac)
{
    ma_result result;

    result = ma_flac_init_internal(pConfig, pFlac);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pFlac->onRead = onRead;
    pFlac->onSeek = onSeek;
    pFlac->onTell = onTell;
    pFlac->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_FLAC)
    {
        pFlac->dr = ma_dr_flac_open(ma_flac_dr_callback__read, ma_flac_dr_callback__seek, pFlac, pAllocationCallbacks);
        if (pFlac->dr == NULL) {
            return MA_INVALID_FILE;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}